

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_ru_u_access<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  pointer puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pointer pvVar14;
  Column_zp_settings *pCVar15;
  _Base_ptr p_Var16;
  _Hash_node_base *p_Var17;
  ulong uVar18;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  uColumns;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  orderedBoundaries;
  Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>
  m;
  shared_count sStack_380;
  char *local_378;
  _Base_ptr local_370;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_368;
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_348;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_318;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  Column_zp_settings *local_1e0;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  local_1d8;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>>
            ();
  pCVar15 = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>
  ::Column_zp_settings::Column_zp_settings(pCVar15,5);
  local_1e0 = pCVar15;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>
  ::
  RU_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>
              *)&local_1d8,&local_318,pCVar15);
  local_368.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var16 = (_Base_ptr)operator_new(0xa8);
  local_368.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var16;
  local_368.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&p_Var16[5]._M_parent;
  memset(p_Var16,0,0xa8);
  local_348._M_impl._0_8_ = (undefined **)0x100000000;
  local_368.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&p_Var16[5]._M_parent;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)p_Var16,&local_348);
  local_348._M_impl._0_8_ = (undefined **)0x100000001;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)((long)local_368.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x18),&local_348);
  local_348._M_impl._0_8_ = (undefined **)0x100000002;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&((_Base_ptr)
                 ((long)local_368.
                        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 0x20))->_M_left,&local_348);
  local_348._M_impl._0_8_ = (undefined **)0x100000003;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&((_Base_ptr)
                 ((long)local_368.
                        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 0x40))->_M_parent,&local_348);
  local_348._M_impl._0_8_ = (undefined **)0x100000004;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)((long)local_368.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 0x60),&local_348);
  local_348._M_impl._0_8_ = (undefined **)0x400000003;
  local_348._M_impl.super__Rb_tree_header._M_header._M_color = 4;
  local_348._M_impl.super__Rb_tree_header._M_header._4_4_ = 4;
  local_348._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x100000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&((_Base_ptr)
                 ((long)local_368.
                        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 0x60))->_M_right,&local_348);
  local_348._M_impl._0_8_ = (undefined **)0x100000006;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&((_Base_ptr)
                 ((long)local_368.
                        super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 0x80))->_M_left,&local_348);
  pvVar14 = local_368.
            super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_368.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_368.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar18 = 0;
    p_Var16 = (_Base_ptr)
              local_368.
              super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets
          [uVar18 % local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count] == (__node_base_ptr)0x0)
      {
LAB_001f5751:
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var2 = local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets
               [uVar18 % local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count]->_M_nxt;
      uVar1 = *(uint *)&p_Var2[1]._M_nxt;
      while ((uint)uVar18 != uVar1) {
        p_Var2 = p_Var2->_M_nxt;
        if ((p_Var2 == (_Hash_node_base *)0x0) ||
           (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
           (ulong)uVar1 % local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count !=
           uVar18 % local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count)) goto LAB_001f5751;
      }
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>>
                ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>
                  *)&local_348,
                 (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
                  *)(p_Var2 + 2));
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>>
                ((witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>
                  *)p_Var16,
                 (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>
                  *)&local_348);
      uVar18 = (ulong)((uint)uVar18 + 1);
      std::
      _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree(&local_348);
      p_Var16 = (_Base_ptr)&p_Var16->_M_right;
    } while (p_Var16 != (_Base_ptr)pvVar14);
  }
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x29f);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar6,0);
  if (local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 5) {
        p_Var17 = p_Var2 + 5;
        goto LAB_001f4fb7;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar18));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var17[2]._M_nxt != 3) {
LAB_001f4fb7:
    p_Var17 = p_Var17->_M_nxt;
    if (p_Var17 == p_Var2 + 5) break;
  }
  sStack_380.pi_ = (sp_counted_base *)0x0;
  local_378 = "!m.is_zero_entry(5, 3, false)";
  local_370 = (_Base_ptr)0x213f7f;
  local_348._M_impl.super__Rb_tree_header._M_header._M_color =
       local_348._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
  local_348._M_impl._0_8_ = &PTR__lazy_ostream_00255150;
  local_348._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_348._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_378;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_380);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x2a0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar7,0);
  if (local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 4) {
        sStack_380.pi_ = (sp_counted_base *)0x0;
        local_378 = "!m.is_zero_column(4, false)";
        local_370 = (_Base_ptr)0x213f9b;
        local_348._M_impl.super__Rb_tree_header._M_header._M_color =
             local_348._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
        local_348._M_impl._0_8_ = &PTR__lazy_ostream_00255150;
        local_348._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_240 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_238 = "";
        local_348._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_378;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_380);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
        uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar8,0);
        if (local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_001f575d;
        p_Var2 = local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x001f519c;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar18));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var17[2]._M_nxt != 3) {
LAB_001f51ca:
    p_Var17 = p_Var17->_M_nxt;
    if (p_Var17 == p_Var2 + 5) goto LAB_001f51f9;
  }
  p_Var3 = p_Var17->_M_nxt;
  p_Var4 = p_Var17[1]._M_nxt;
  p_Var4->_M_nxt = p_Var3;
  p_Var3[1]._M_nxt = p_Var4;
  p_Var17->_M_nxt = (_Hash_node_base *)0x0;
  p_Var17[1]._M_nxt = (_Hash_node_base *)0x0;
  Gudhi::
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>
  ::destroy((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>_>
             *)p_Var2[4]._M_nxt,(pointer)(p_Var17 + -1));
LAB_001f51f9:
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x2a2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar9,0);
  if (local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 5) {
        p_Var17 = p_Var2 + 5;
        goto LAB_001f5289;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar18));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var17[2]._M_nxt != 3) {
LAB_001f5289:
    p_Var17 = p_Var17->_M_nxt;
    if (p_Var17 == p_Var2 + 5) break;
  }
  sStack_380.pi_ = (sp_counted_base *)0x0;
  local_378 = "m.is_zero_entry(5, 3, false)";
  local_370 = (_Base_ptr)0x213f7f;
  local_348._M_impl.super__Rb_tree_header._M_header._M_color =
       local_348._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
  local_348._M_impl._0_8_ = &PTR__lazy_ostream_00255150;
  local_348._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_348._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_378;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_380);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x2a3);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar10,0);
  if (local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 4) {
        sStack_380.pi_ = (sp_counted_base *)0x0;
        local_378 = "!m.is_zero_column(4, false)";
        local_370 = (_Base_ptr)0x213f9b;
        local_348._M_impl.super__Rb_tree_header._M_header._M_color =
             local_348._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
        local_348._M_impl._0_8_ = &PTR__lazy_ostream_00255150;
        local_348._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_2a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_298 = "";
        local_348._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_378;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_380);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
        uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar11,0);
        if (local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_001f575d;
        p_Var2 = local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x001f546b;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar18));
  }
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar18))) {
joined_r0x001f519c:
    if (uVar1 == 5) {
      p_Var17 = p_Var2 + 5;
      goto LAB_001f51ca;
    }
  }
LAB_001f575d:
  std::__throw_out_of_range("_Map_base::at");
joined_r0x001f546b:
  if (uVar1 != 4) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
       (ulong)uVar1 % local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count != uVar18))
    goto LAB_001f575d;
    goto joined_r0x001f546b;
  }
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>::Delete_disposer>
            ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              *)(p_Var2 + 5),
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
              *)(p_Var2 + 2));
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x2a5);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar12,0);
  if (local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff] == (__node_base_ptr)0x0)
  goto LAB_001f5799;
  p_Var2 = local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var2[1]._M_nxt;
  while (uVar1 != 5) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
       (ulong)uVar1 % local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count != uVar18)) {
LAB_001f5799:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  p_Var17 = p_Var2 + 5;
  do {
    p_Var17 = p_Var17->_M_nxt;
    if (p_Var17 == p_Var2 + 5) break;
  } while (*(int *)&p_Var17[2]._M_nxt != 3);
  sStack_380.pi_ = (sp_counted_base *)0x0;
  local_378 = "m.is_zero_entry(5, 3, false)";
  local_370 = (_Base_ptr)0x213f7f;
  local_348._M_impl.super__Rb_tree_header._M_header._M_color =
       local_348._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
  local_348._M_impl._0_8_ = &PTR__lazy_ostream_00255150;
  local_348._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c8 = "";
  local_348._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_378;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_380);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x2a6);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar13,0);
  if (local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_1d8.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 4) {
        sStack_380.pi_ = (sp_counted_base *)0x0;
        local_378 = "m.is_zero_column(4, false)";
        local_370 = (_Base_ptr)0x213f9b;
        local_348._M_impl.super__Rb_tree_header._M_header._M_color =
             local_348._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
        local_348._M_impl._0_8_ = &PTR__lazy_ostream_00255150;
        local_348._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_300 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_2f8 = "";
        local_348._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_378;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_380);
        std::
        vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ::~vector(&local_368);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
        ::reset(&local_1d8,local_1e0);
        pCVar15 = local_1e0;
        if (local_1e0 != (Column_settings *)0x0) {
          boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
                    ((pool<boost::default_user_allocator_malloc_free> *)&local_1e0->entryConstructor
                    );
          puVar5 = (pCVar15->operators).inverse_.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (puVar5 != (pointer)0x0) {
            operator_delete(puVar5,(long)(pCVar15->operators).inverse_.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)puVar5);
          }
        }
        operator_delete(pCVar15,0x58);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
        ::~RU_matrix(&local_1d8);
        std::
        vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
        ::~vector(&local_318);
        return;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_1d8.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar18));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_ru_u_access() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(orderedBoundaries, 5);

  std::vector<witness_content<typename Matrix::Column> > uColumns(7);
  if constexpr (Matrix::Option_list::is_z2) {
    uColumns[0] = {0};
    uColumns[1] = {1};
    uColumns[2] = {2};
    uColumns[3] = {3, 5};
    uColumns[4] = {4, 5};
    uColumns[5] = {5};
    uColumns[6] = {6};
  } else {
    uColumns[0] = {{0, 1}};
    uColumns[1] = {{1, 1}};
    uColumns[2] = {{2, 1}};
    uColumns[3] = {{3, 1}};
    uColumns[4] = {{4, 1}};
    uColumns[5] = {{3, 4}, {4, 4}, {5, 1}};
    uColumns[6] = {{6, 1}};
  }

  unsigned int i = 0;
  for (auto& c : uColumns) {
    const auto& col = m.get_column(i++, false);  // to force the const version
    test_column_equality<typename Matrix::Column>(c, get_column_content_via_iterators(col));
  }

  if constexpr (Matrix::Option_list::is_z2) {
    BOOST_CHECK(!m.is_zero_entry(3, 5, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_entry(3, 5, false);
    BOOST_CHECK(m.is_zero_entry(3, 5, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_column(4, false);
    BOOST_CHECK(m.is_zero_entry(3, 5, false));
    BOOST_CHECK(m.is_zero_column(4, false));
  } else {
    BOOST_CHECK(!m.is_zero_entry(5, 3, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_entry(5, 3, false);
    BOOST_CHECK(m.is_zero_entry(5, 3, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_column(4, false);
    BOOST_CHECK(m.is_zero_entry(5, 3, false));
    BOOST_CHECK(m.is_zero_column(4, false));
  }
}